

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O3

void aom_highbd_blend_a64_d16_mask_avx2
               (uint8_t *dst8,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
               int h,int subw,int subh,ConvolveParams *conv_params,int bd)

{
  undefined8 uVar1;
  long lVar2;
  char cVar3;
  ushort uVar4;
  char cVar5;
  CONV_BUF_TYPE *pCVar6;
  undefined1 *puVar7;
  uint8_t *puVar8;
  long lVar9;
  undefined1 (*pauVar10) [16];
  int iVar11;
  CONV_BUF_TYPE *pCVar12;
  uint8_t *puVar13;
  uint uVar14;
  int iVar15;
  uint8_t *puVar16;
  undefined1 auVar17 [32];
  ushort uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  
  iVar15 = conv_params->round_1 + conv_params->round_0;
  cVar5 = (char)iVar15;
  cVar3 = (byte)bd - cVar5;
  iVar11 = ((1 << (0xdU - cVar5 & 0x1f)) + (-1 << (cVar3 + 0xdU & 0x1f)) +
           (-1 << (cVar3 + 0xeU & 0x1f))) * 0x40;
  uVar14 = 0x14 - iVar15;
  uVar4 = (ushort)(-1 << ((byte)bd & 0x1f));
  uVar18 = uVar4 ^ 0xffff;
  pauVar10 = (undefined1 (*) [16])((long)dst8 * 2);
  auVar17._4_4_ = iVar11;
  auVar17._0_4_ = iVar11;
  auVar17._8_4_ = iVar11;
  auVar17._12_4_ = iVar11;
  auVar17._16_4_ = iVar11;
  auVar17._20_4_ = iVar11;
  auVar17._24_4_ = iVar11;
  auVar17._28_4_ = iVar11;
  auVar19._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) ^ 0xffffffffffffffff;
  auVar19._8_2_ = uVar18;
  auVar19._10_2_ = uVar18;
  auVar19._12_2_ = uVar18;
  auVar19._14_2_ = uVar18;
  auVar19._16_2_ = uVar18;
  auVar19._18_2_ = uVar18;
  auVar19._20_2_ = uVar18;
  auVar19._22_2_ = uVar18;
  auVar19._24_2_ = uVar18;
  auVar19._26_2_ = uVar18;
  auVar19._28_2_ = uVar18;
  auVar19._30_2_ = uVar18;
  if (subh == 0 && subw == 0) {
    if (w == 8) {
      auVar23._8_2_ = 0x40;
      auVar23._0_8_ = 0x40004000400040;
      auVar23._10_2_ = 0x40;
      auVar23._12_2_ = 0x40;
      auVar23._14_2_ = 0x40;
      auVar23._16_2_ = 0x40;
      auVar23._18_2_ = 0x40;
      auVar23._20_2_ = 0x40;
      auVar23._22_2_ = 0x40;
      auVar23._24_2_ = 0x40;
      auVar23._26_2_ = 0x40;
      auVar23._28_2_ = 0x40;
      auVar23._30_2_ = 0x40;
      do {
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *(ulong *)((long)mask + (long)(int)mask_stride);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(ulong *)mask;
        auVar27 = vpunpcklqdq_avx(auVar27,auVar32);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)((long)mask + (long)(int)(mask_stride * 2));
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)((long)mask + (long)(int)(mask_stride * 3));
        auVar32 = vpunpcklqdq_avx(auVar37,auVar33);
        auVar40._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])src0 +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + (long)(int)src0_stride * 2);
        auVar40._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * *(undefined1 (*) [16])src0
        ;
        auVar39 = vpmovzxbw_avx2(auVar27);
        auVar50._0_16_ =
             ZEXT116(0) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + (long)(int)(src0_stride * 2) * 2) +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + (long)(int)(src0_stride * 3) * 2);
        auVar50._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + (long)(int)(src0_stride * 2) * 2);
        auVar22 = vpmovzxbw_avx2(auVar32);
        auVar61._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])src1 +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)(int)src1_stride * 2);
        auVar61._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * *(undefined1 (*) [16])src1
        ;
        auVar66._0_16_ =
             ZEXT116(0) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)(int)(src1_stride * 2) * 2) +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)(int)(src1_stride * 3) * 2);
        auVar66._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)(int)(src1_stride * 2) * 2);
        auVar42 = vpsubw_avx2(auVar23,auVar39);
        auVar54 = vpsubw_avx2(auVar23,auVar22);
        auVar24 = vpmulhuw_avx2(auVar39,auVar40);
        auVar39 = vpmullw_avx2(auVar40,auVar39);
        auVar40 = vpunpckhwd_avx2(auVar39,auVar24);
        auVar53 = vpunpcklwd_avx2(auVar39,auVar24);
        auVar39 = vpmulhuw_avx2(auVar42,auVar61);
        auVar24 = vpmullw_avx2(auVar42,auVar61);
        auVar42 = vpunpckhwd_avx2(auVar24,auVar39);
        auVar61 = vpunpcklwd_avx2(auVar24,auVar39);
        auVar39 = vpmulhuw_avx2(auVar50,auVar22);
        auVar22 = vpmullw_avx2(auVar50,auVar22);
        auVar50 = vpunpckhwd_avx2(auVar22,auVar39);
        auVar29 = vpunpcklwd_avx2(auVar22,auVar39);
        auVar22 = vpmulhuw_avx2(auVar54,auVar66);
        auVar24 = vpmullw_avx2(auVar54,auVar66);
        auVar54 = vpunpckhwd_avx2(auVar24,auVar22);
        auVar39 = vpaddd_avx2(auVar17,auVar40);
        auVar39 = vpaddd_avx2(auVar42,auVar39);
        auVar42 = vpsrad_avx2(auVar39,ZEXT416(uVar14));
        auVar39 = vpaddd_avx2(auVar17,auVar53);
        auVar39 = vpaddd_avx2(auVar61,auVar39);
        auVar39 = vpsrad_avx2(auVar39,ZEXT416(uVar14));
        auVar40 = vpunpcklwd_avx2(auVar24,auVar22);
        auVar39 = vpackssdw_avx2(auVar39,auVar42);
        auVar22 = vpaddd_avx2(auVar50,auVar17);
        auVar22 = vpaddd_avx2(auVar54,auVar22);
        auVar24 = vpsrad_avx2(auVar22,ZEXT416(uVar14));
        auVar22 = vpaddd_avx2(auVar17,auVar29);
        auVar22 = vpaddd_avx2(auVar40,auVar22);
        auVar22 = vpsrad_avx2(auVar22,ZEXT416(uVar14));
        auVar22 = vpackssdw_avx2(auVar22,auVar24);
        auVar39 = vpmaxsw_avx2(auVar39,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar24 = vpminsw_avx2(auVar39,auVar19);
        auVar39 = vpmaxsw_avx2(auVar22,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar39 = vpminsw_avx2(auVar39,auVar19);
        *pauVar10 = auVar24._16_16_;
        *(undefined1 (*) [16])(*pauVar10 + (long)(int)dst_stride * 2) = auVar24._0_16_;
        *(undefined1 (*) [16])(*pauVar10 + (long)(int)(dst_stride * 2) * 2) = auVar39._16_16_;
        *(undefined1 (*) [16])(*pauVar10 + (long)(int)(dst_stride * 3) * 2) = auVar39._0_16_;
        mask = (uint8_t *)((long)mask + (long)(int)(mask_stride << 2));
        src1 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src1 + (long)(int)(src1_stride << 2) * 2);
        src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src0 + (long)(int)(src0_stride << 2) * 2);
        pauVar10 = (undefined1 (*) [16])(*pauVar10 + (long)(int)(dst_stride << 2) * 2);
        h = h + -4;
      } while (h != 0);
    }
    else if (w == 4) {
      auVar22._8_2_ = 0x40;
      auVar22._0_8_ = 0x40004000400040;
      auVar22._10_2_ = 0x40;
      auVar22._12_2_ = 0x40;
      auVar22._14_2_ = 0x40;
      auVar22._16_2_ = 0x40;
      auVar22._18_2_ = 0x40;
      auVar22._20_2_ = 0x40;
      auVar22._22_2_ = 0x40;
      auVar22._24_2_ = 0x40;
      auVar22._26_2_ = 0x40;
      auVar22._28_2_ = 0x40;
      auVar22._30_2_ = 0x40;
      do {
        auVar27 = vpinsrd_avx(ZEXT416(*(uint *)mask),
                              *(undefined4 *)((long)mask + (ulong)mask_stride),1);
        auVar27 = vpinsrd_avx(auVar27,*(undefined4 *)((long)mask + (ulong)(mask_stride * 2)),2);
        auVar27 = vpinsrd_avx(auVar27,*(undefined4 *)((long)mask + (ulong)(mask_stride * 3)),3);
        auVar23 = vpmovzxbw_avx2(auVar27);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(ulong *)src0;
        auVar27 = vmovhps_avx(auVar31,*(undefined8 *)((long)src0 + (long)(int)src0_stride * 2));
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)((long)src0 + (long)(int)(src0_stride * 2) * 2);
        auVar32 = vmovhps_avx(auVar35,*(undefined8 *)((long)src0 + (long)(int)(src0_stride * 3) * 2)
                             );
        auVar42._16_16_ = auVar32;
        auVar42._0_16_ = auVar27;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)src1;
        auVar27 = vmovhps_avx(auVar36,*(undefined8 *)((long)src1 + (long)(int)src1_stride * 2));
        auVar47._8_8_ = 0;
        auVar47._0_8_ = *(ulong *)((long)src1 + (long)(int)(src1_stride * 2) * 2);
        auVar32 = vmovhps_avx(auVar47,*(undefined8 *)((long)src1 + (long)(int)(src1_stride * 3) * 2)
                             );
        auVar53._16_16_ = auVar32;
        auVar53._0_16_ = auVar27;
        auVar24 = vpsubw_avx2(auVar22,auVar23);
        auVar39 = vpmulhuw_avx2(auVar23,auVar42);
        auVar23 = vpmullw_avx2(auVar42,auVar23);
        auVar42 = vpunpckhwd_avx2(auVar23,auVar39);
        auVar54 = vpunpcklwd_avx2(auVar23,auVar39);
        auVar23 = vpmulhuw_avx2(auVar24,auVar53);
        auVar39 = vpmullw_avx2(auVar24,auVar53);
        auVar24 = vpunpckhwd_avx2(auVar39,auVar23);
        auVar40 = vpunpcklwd_avx2(auVar39,auVar23);
        auVar23 = vpaddd_avx2(auVar17,auVar42);
        auVar23 = vpaddd_avx2(auVar24,auVar23);
        auVar39 = vpsrad_avx2(auVar23,ZEXT416(uVar14));
        auVar23 = vpaddd_avx2(auVar17,auVar54);
        auVar23 = vpaddd_avx2(auVar23,auVar40);
        auVar23 = vpsrad_avx2(auVar23,ZEXT416(uVar14));
        auVar23 = vpackssdw_avx2(auVar23,auVar39);
        auVar23 = vpmaxsw_avx2(auVar23,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar23 = vpminsw_avx2(auVar23,auVar19);
        uVar1 = vpextrq_avx(auVar23._16_16_,1);
        *(undefined8 *)(*pauVar10 + (long)(int)(dst_stride * 3) * 2) = uVar1;
        *(long *)(*pauVar10 + (long)(int)(dst_stride * 2) * 2) = auVar23._16_8_;
        uVar1 = vpextrq_avx(auVar23._0_16_,1);
        *(undefined8 *)(*pauVar10 + (long)(int)dst_stride * 2) = uVar1;
        *(long *)*pauVar10 = auVar23._0_8_;
        mask = (uint8_t *)((long)mask + (ulong)(mask_stride << 2));
        src1 = (CONV_BUF_TYPE *)((long)src1 + (ulong)(src1_stride << 2) * 2);
        src0 = (CONV_BUF_TYPE *)((long)src0 + (ulong)(src0_stride << 2) * 2);
        pauVar10 = (undefined1 (*) [16])(*pauVar10 + (ulong)(dst_stride << 2) * 2);
        h = h + -4;
      } while (h != 0);
    }
    else if (0 < h) {
      pCVar12 = src1 + (int)src1_stride;
      pCVar6 = src0 + (int)src0_stride;
      puVar7 = *pauVar10 + (long)(int)dst_stride * 2;
      lVar2 = (long)(int)(dst_stride * 2) * 2;
      puVar8 = mask + (int)mask_stride;
      iVar11 = 0;
      auVar39._8_2_ = 0x40;
      auVar39._0_8_ = 0x40004000400040;
      auVar39._10_2_ = 0x40;
      auVar39._12_2_ = 0x40;
      auVar39._14_2_ = 0x40;
      auVar39._16_2_ = 0x40;
      auVar39._18_2_ = 0x40;
      auVar39._20_2_ = 0x40;
      auVar39._22_2_ = 0x40;
      auVar39._24_2_ = 0x40;
      auVar39._26_2_ = 0x40;
      auVar39._28_2_ = 0x40;
      auVar39._30_2_ = 0x40;
      do {
        if (0 < w) {
          lVar9 = 0;
          do {
            auVar23 = vpmovzxbw_avx2(*(undefined1 (*) [16])(mask + lVar9));
            auVar22 = vpmovzxbw_avx2(*(undefined1 (*) [16])(puVar8 + lVar9));
            auVar42 = vpsubw_avx2(auVar39,auVar23);
            auVar54 = vpsubw_avx2(auVar39,auVar22);
            auVar24 = vpmulhuw_avx2(auVar23,*(undefined1 (*) [32])(src0 + lVar9));
            auVar23 = vpmullw_avx2(*(undefined1 (*) [32])(src0 + lVar9),auVar23);
            auVar40 = vpunpckhwd_avx2(auVar23,auVar24);
            auVar50 = vpunpcklwd_avx2(auVar23,auVar24);
            auVar23 = vpmulhuw_avx2(auVar42,*(undefined1 (*) [32])(src1 + lVar9));
            auVar24 = vpmullw_avx2(*(undefined1 (*) [32])(src1 + lVar9),auVar42);
            auVar42 = vpunpckhwd_avx2(auVar24,auVar23);
            auVar53 = vpunpcklwd_avx2(auVar24,auVar23);
            auVar23 = vpmulhuw_avx2(*(undefined1 (*) [32])(pCVar6 + lVar9),auVar22);
            auVar22 = vpmullw_avx2(*(undefined1 (*) [32])(pCVar6 + lVar9),auVar22);
            auVar24 = vpunpckhwd_avx2(auVar22,auVar23);
            auVar61 = vpunpcklwd_avx2(auVar22,auVar23);
            auVar23 = vpmulhuw_avx2(auVar54,*(undefined1 (*) [32])(pCVar12 + lVar9));
            auVar22 = vpmullw_avx2(*(undefined1 (*) [32])(pCVar12 + lVar9),auVar54);
            auVar54 = vpunpckhwd_avx2(auVar22,auVar23);
            auVar29 = vpunpcklwd_avx2(auVar22,auVar23);
            auVar23 = vpaddd_avx2(auVar17,auVar40);
            auVar23 = vpaddd_avx2(auVar42,auVar23);
            auVar22 = vpsrad_avx2(auVar23,ZEXT416(uVar14));
            auVar23 = vpaddd_avx2(auVar17,auVar50);
            auVar23 = vpaddd_avx2(auVar53,auVar23);
            auVar23 = vpsrad_avx2(auVar23,ZEXT416(uVar14));
            auVar23 = vpackssdw_avx2(auVar23,auVar22);
            auVar22 = vpaddd_avx2(auVar24,auVar17);
            auVar22 = vpaddd_avx2(auVar54,auVar22);
            auVar24 = vpsrad_avx2(auVar22,ZEXT416(uVar14));
            auVar22 = vpaddd_avx2(auVar17,auVar61);
            auVar22 = vpaddd_avx2(auVar29,auVar22);
            auVar22 = vpsrad_avx2(auVar22,ZEXT416(uVar14));
            auVar22 = vpackssdw_avx2(auVar22,auVar24);
            auVar23 = vpmaxsw_avx2(auVar23,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar24 = vpminsw_avx2(auVar23,auVar19);
            auVar23 = vpmaxsw_avx2(auVar22,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar23 = vpminsw_avx2(auVar23,auVar19);
            *(undefined1 (*) [32])(*pauVar10 + lVar9 * 2) = auVar24;
            *(undefined1 (*) [32])(puVar7 + lVar9 * 2) = auVar23;
            lVar9 = lVar9 + 0x10;
          } while (lVar9 < w);
        }
        mask = mask + (int)(mask_stride * 2);
        iVar11 = iVar11 + 2;
        pCVar12 = pCVar12 + (int)(src1_stride * 2);
        src1 = src1 + (int)(src1_stride * 2);
        pCVar6 = pCVar6 + (int)(src0_stride * 2);
        src0 = src0 + (int)(src0_stride * 2);
        puVar7 = puVar7 + lVar2;
        pauVar10 = (undefined1 (*) [16])(*pauVar10 + lVar2);
        puVar8 = puVar8 + (int)(mask_stride * 2);
      } while (iVar11 < h);
    }
  }
  else {
    if (subh != 1 || subw != 1) {
      aom_highbd_blend_a64_d16_mask_c
                (dst8,dst_stride,src0,src0_stride,src1,src1_stride,mask,mask_stride,w,h,subw,subh,
                 conv_params,bd);
      return;
    }
    if (w == 8) {
      auVar24[8] = 1;
      auVar24._0_8_ = 0x101010101010101;
      auVar24[9] = 1;
      auVar24[10] = 1;
      auVar24[0xb] = 1;
      auVar24[0xc] = 1;
      auVar24[0xd] = 1;
      auVar24[0xe] = 1;
      auVar24[0xf] = 1;
      auVar24[0x10] = 1;
      auVar24[0x11] = 1;
      auVar24[0x12] = 1;
      auVar24[0x13] = 1;
      auVar24[0x14] = 1;
      auVar24[0x15] = 1;
      auVar24[0x16] = 1;
      auVar24[0x17] = 1;
      auVar24[0x18] = 1;
      auVar24[0x19] = 1;
      auVar24[0x1a] = 1;
      auVar24[0x1b] = 1;
      auVar24[0x1c] = 1;
      auVar24[0x1d] = 1;
      auVar24[0x1e] = 1;
      auVar24[0x1f] = 1;
      auVar54._8_2_ = 2;
      auVar54._0_8_ = 0x2000200020002;
      auVar54._10_2_ = 2;
      auVar54._12_2_ = 2;
      auVar54._14_2_ = 2;
      auVar54._16_2_ = 2;
      auVar54._18_2_ = 2;
      auVar54._20_2_ = 2;
      auVar54._22_2_ = 2;
      auVar54._24_2_ = 2;
      auVar54._26_2_ = 2;
      auVar54._28_2_ = 2;
      auVar54._30_2_ = 2;
      auVar29._8_2_ = 0x40;
      auVar29._0_8_ = 0x40004000400040;
      auVar29._10_2_ = 0x40;
      auVar29._12_2_ = 0x40;
      auVar29._14_2_ = 0x40;
      auVar29._16_2_ = 0x40;
      auVar29._18_2_ = 0x40;
      auVar29._20_2_ = 0x40;
      auVar29._22_2_ = 0x40;
      auVar29._24_2_ = 0x40;
      auVar29._26_2_ = 0x40;
      auVar29._28_2_ = 0x40;
      auVar29._30_2_ = 0x40;
      do {
        auVar41._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])mask +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + (int)(mask_stride * 2));
        auVar41._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * *(undefined1 (*) [16])mask
        ;
        auVar51._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + (int)mask_stride) +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + (int)(mask_stride * 3));
        auVar51._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + (int)mask_stride);
        auVar23 = vpaddusb_avx2(auVar51,auVar41);
        auVar23 = vpmaddubsw_avx2(auVar23,auVar24);
        auVar23 = vpaddw_avx2(auVar23,auVar54);
        auVar39 = vpsrlw_avx2(auVar23,2);
        auVar52._0_16_ =
             ZEXT116(0) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + (int)(mask_stride * 4)) +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + (int)(mask_stride * 6));
        auVar52._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + (int)(mask_stride * 4));
        auVar62._0_16_ =
             ZEXT116(0) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + (int)(mask_stride * 5)) +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + (int)(mask_stride * 7));
        auVar62._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + (int)(mask_stride * 5));
        auVar23 = vpaddusb_avx2(auVar52,auVar62);
        auVar23 = vpmaddubsw_avx2(auVar23,auVar24);
        auVar63._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])src0 +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + (long)(int)src0_stride * 2);
        auVar63._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * *(undefined1 (*) [16])src0
        ;
        auVar23 = vpaddw_avx2(auVar23,auVar54);
        auVar67._0_16_ =
             ZEXT116(0) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + (long)(int)(src0_stride * 2) * 2) +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + (long)(int)(src0_stride * 3) * 2);
        auVar67._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + (long)(int)(src0_stride * 2) * 2);
        auVar53 = vpsrlw_avx2(auVar23,2);
        auVar68._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])src1 +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)(int)src1_stride * 2);
        auVar68._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * *(undefined1 (*) [16])src1
        ;
        auVar69._0_16_ =
             ZEXT116(0) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)(int)(src1_stride * 2) * 2) +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)(int)(src1_stride * 3) * 2);
        auVar69._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)(int)(src1_stride * 2) * 2);
        auVar22 = vpsubw_avx2(auVar29,auVar39);
        auVar42 = vpsubw_avx2(auVar29,auVar53);
        auVar23 = vpmulhuw_avx2(auVar63,auVar39);
        auVar39 = vpmullw_avx2(auVar63,auVar39);
        auVar40 = vpunpckhwd_avx2(auVar39,auVar23);
        auVar66 = vpunpcklwd_avx2(auVar39,auVar23);
        auVar23 = vpmulhuw_avx2(auVar22,auVar68);
        auVar39 = vpmullw_avx2(auVar22,auVar68);
        auVar50 = vpunpckhwd_avx2(auVar39,auVar23);
        auVar41 = vpunpcklwd_avx2(auVar39,auVar23);
        auVar23 = vpmulhuw_avx2(auVar53,auVar67);
        auVar39 = vpmullw_avx2(auVar53,auVar67);
        auVar53 = vpunpckhwd_avx2(auVar39,auVar23);
        auVar51 = vpunpcklwd_avx2(auVar39,auVar23);
        auVar39 = vpmulhuw_avx2(auVar42,auVar69);
        auVar22 = vpmullw_avx2(auVar42,auVar69);
        auVar61 = vpunpckhwd_avx2(auVar22,auVar39);
        auVar23 = vpaddd_avx2(auVar40,auVar17);
        auVar23 = vpaddd_avx2(auVar23,auVar50);
        auVar42 = vpsrad_avx2(auVar23,ZEXT416(uVar14));
        auVar23 = vpaddd_avx2(auVar17,auVar66);
        auVar23 = vpaddd_avx2(auVar41,auVar23);
        auVar23 = vpsrad_avx2(auVar23,ZEXT416(uVar14));
        auVar40 = vpunpcklwd_avx2(auVar22,auVar39);
        auVar23 = vpackssdw_avx2(auVar23,auVar42);
        auVar39 = vpaddd_avx2(auVar53,auVar17);
        auVar39 = vpaddd_avx2(auVar39,auVar61);
        auVar22 = vpsrad_avx2(auVar39,ZEXT416(uVar14));
        auVar39 = vpaddd_avx2(auVar51,auVar17);
        auVar39 = vpaddd_avx2(auVar39,auVar40);
        auVar39 = vpsrad_avx2(auVar39,ZEXT416(uVar14));
        auVar39 = vpackssdw_avx2(auVar39,auVar22);
        auVar23 = vpmaxsw_avx2(auVar23,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar22 = vpminsw_avx2(auVar23,auVar19);
        auVar23 = vpmaxsw_avx2(auVar39,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar23 = vpminsw_avx2(auVar23,auVar19);
        *pauVar10 = auVar22._16_16_;
        *(undefined1 (*) [16])(*pauVar10 + (long)(int)dst_stride * 2) = auVar22._0_16_;
        *(undefined1 (*) [16])(*pauVar10 + (long)(int)(dst_stride * 2) * 2) = auVar23._16_16_;
        *(undefined1 (*) [16])(*pauVar10 + (long)(int)(dst_stride * 3) * 2) = auVar23._0_16_;
        mask = *(undefined1 (*) [16])mask + (int)(mask_stride * 8);
        src1 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src1 + (long)(int)(src1_stride << 2) * 2);
        src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src0 + (long)(int)(src0_stride << 2) * 2);
        pauVar10 = (undefined1 (*) [16])(*pauVar10 + (long)(int)(dst_stride << 2) * 2);
        h = h + -4;
      } while (h != 0);
    }
    else if (w == 4) {
      auVar21[8] = 1;
      auVar21._0_8_ = 0x101010101010101;
      auVar21[9] = 1;
      auVar21[10] = 1;
      auVar21[0xb] = 1;
      auVar21[0xc] = 1;
      auVar21[0xd] = 1;
      auVar21[0xe] = 1;
      auVar21[0xf] = 1;
      auVar21[0x10] = 1;
      auVar21[0x11] = 1;
      auVar21[0x12] = 1;
      auVar21[0x13] = 1;
      auVar21[0x14] = 1;
      auVar21[0x15] = 1;
      auVar21[0x16] = 1;
      auVar21[0x17] = 1;
      auVar21[0x18] = 1;
      auVar21[0x19] = 1;
      auVar21[0x1a] = 1;
      auVar21[0x1b] = 1;
      auVar21[0x1c] = 1;
      auVar21[0x1d] = 1;
      auVar21[0x1e] = 1;
      auVar21[0x1f] = 1;
      auVar26._8_2_ = 2;
      auVar26._0_8_ = 0x2000200020002;
      auVar26._10_2_ = 2;
      auVar26._12_2_ = 2;
      auVar26._14_2_ = 2;
      auVar26._16_2_ = 2;
      auVar26._18_2_ = 2;
      auVar26._20_2_ = 2;
      auVar26._22_2_ = 2;
      auVar26._24_2_ = 2;
      auVar26._26_2_ = 2;
      auVar26._28_2_ = 2;
      auVar26._30_2_ = 2;
      auVar28._8_2_ = 0x40;
      auVar28._0_8_ = 0x40004000400040;
      auVar28._10_2_ = 0x40;
      auVar28._12_2_ = 0x40;
      auVar28._14_2_ = 0x40;
      auVar28._16_2_ = 0x40;
      auVar28._18_2_ = 0x40;
      auVar28._20_2_ = 0x40;
      auVar28._22_2_ = 0x40;
      auVar28._24_2_ = 0x40;
      auVar28._26_2_ = 0x40;
      auVar28._28_2_ = 0x40;
      auVar28._30_2_ = 0x40;
      do {
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)((long)mask + (ulong)(mask_stride * 6));
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)((long)mask + (ulong)(mask_stride * 4));
        auVar27 = vpunpcklqdq_avx(auVar43,auVar34);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)((long)mask + (ulong)(mask_stride * 2));
        auVar55._8_8_ = 0;
        auVar55._0_8_ = *(ulong *)mask;
        auVar32 = vpunpcklqdq_avx(auVar55,auVar44);
        auVar38._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar32;
        auVar38._16_16_ = ZEXT116(1) * auVar27;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)((long)mask + (ulong)(mask_stride * 7));
        auVar56._8_8_ = 0;
        auVar56._0_8_ = *(ulong *)((long)mask + (ulong)(mask_stride * 5));
        auVar27 = vpunpcklqdq_avx(auVar56,auVar45);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = *(ulong *)((long)mask + (ulong)(mask_stride * 3));
        auVar64._8_8_ = 0;
        auVar64._0_8_ = *(ulong *)((long)mask + (ulong)mask_stride);
        auVar32 = vpunpcklqdq_avx(auVar64,auVar57);
        auVar48._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar32;
        auVar48._16_16_ = ZEXT116(1) * auVar27;
        auVar23 = vpaddusb_avx2(auVar48,auVar38);
        auVar23 = vpmaddubsw_avx2(auVar23,auVar21);
        auVar23 = vpaddw_avx2(auVar23,auVar26);
        auVar39 = vpsrlw_avx2(auVar23,2);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)src0;
        auVar27 = vmovhps_avx(auVar46,*(undefined8 *)((long)src0 + (long)(int)src0_stride * 2));
        auVar58._8_8_ = 0;
        auVar58._0_8_ = *(ulong *)((long)src0 + (long)(int)(src0_stride * 2) * 2);
        auVar32 = vmovhps_avx(auVar58,*(undefined8 *)((long)src0 + (long)(int)(src0_stride * 3) * 2)
                             );
        auVar49._16_16_ = auVar32;
        auVar49._0_16_ = auVar27;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = *(ulong *)src1;
        auVar27 = vmovhps_avx(auVar59,*(undefined8 *)((long)src1 + (long)(int)src1_stride * 2));
        auVar65._8_8_ = 0;
        auVar65._0_8_ = *(ulong *)((long)src1 + (long)(int)(src1_stride * 2) * 2);
        auVar32 = vmovhps_avx(auVar65,*(undefined8 *)((long)src1 + (long)(int)(src1_stride * 3) * 2)
                             );
        auVar60._16_16_ = auVar32;
        auVar60._0_16_ = auVar27;
        auVar22 = vpsubw_avx2(auVar28,auVar39);
        auVar23 = vpmulhuw_avx2(auVar49,auVar39);
        auVar39 = vpmullw_avx2(auVar49,auVar39);
        auVar24 = vpunpckhwd_avx2(auVar39,auVar23);
        auVar42 = vpunpcklwd_avx2(auVar39,auVar23);
        auVar23 = vpmulhuw_avx2(auVar22,auVar60);
        auVar39 = vpmullw_avx2(auVar22,auVar60);
        auVar22 = vpunpckhwd_avx2(auVar39,auVar23);
        auVar54 = vpunpcklwd_avx2(auVar39,auVar23);
        auVar23 = vpaddd_avx2(auVar24,auVar17);
        auVar23 = vpaddd_avx2(auVar23,auVar22);
        auVar39 = vpsrad_avx2(auVar23,ZEXT416(uVar14));
        auVar23 = vpaddd_avx2(auVar17,auVar42);
        auVar23 = vpaddd_avx2(auVar54,auVar23);
        auVar23 = vpsrad_avx2(auVar23,ZEXT416(uVar14));
        auVar23 = vpackssdw_avx2(auVar23,auVar39);
        auVar23 = vpmaxsw_avx2(auVar23,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar23 = vpminsw_avx2(auVar23,auVar19);
        uVar1 = vpextrq_avx(auVar23._16_16_,1);
        *(undefined8 *)(*pauVar10 + (long)(int)(dst_stride * 3) * 2) = uVar1;
        *(long *)(*pauVar10 + (long)(int)(dst_stride * 2) * 2) = auVar23._16_8_;
        uVar1 = vpextrq_avx(auVar23._0_16_,1);
        *(undefined8 *)(*pauVar10 + (long)(int)dst_stride * 2) = uVar1;
        *(long *)*pauVar10 = auVar23._0_8_;
        mask = (uint8_t *)((long)mask + (ulong)(mask_stride * 8));
        src1 = (CONV_BUF_TYPE *)((long)src1 + (ulong)(src1_stride << 2) * 2);
        src0 = (CONV_BUF_TYPE *)((long)src0 + (ulong)(src0_stride << 2) * 2);
        pauVar10 = (undefined1 (*) [16])(*pauVar10 + (ulong)(dst_stride << 2) * 2);
        h = h + -4;
      } while (h != 0);
    }
    else if (0 < h) {
      iVar15 = mask_stride << 2;
      pCVar12 = src1 + (int)src1_stride;
      pCVar6 = src0 + (int)src0_stride;
      puVar7 = *pauVar10 + (long)(int)dst_stride * 2;
      lVar2 = (long)(int)(dst_stride * 2) * 2;
      puVar13 = mask + (int)(mask_stride * 3);
      puVar16 = mask + (int)(mask_stride * 2);
      auVar20[8] = 1;
      auVar20._0_8_ = 0x101010101010101;
      auVar20[9] = 1;
      auVar20[10] = 1;
      auVar20[0xb] = 1;
      auVar20[0xc] = 1;
      auVar20[0xd] = 1;
      auVar20[0xe] = 1;
      auVar20[0xf] = 1;
      auVar20[0x10] = 1;
      auVar20[0x11] = 1;
      auVar20[0x12] = 1;
      auVar20[0x13] = 1;
      auVar20[0x14] = 1;
      auVar20[0x15] = 1;
      auVar20[0x16] = 1;
      auVar20[0x17] = 1;
      auVar20[0x18] = 1;
      auVar20[0x19] = 1;
      auVar20[0x1a] = 1;
      auVar20[0x1b] = 1;
      auVar20[0x1c] = 1;
      auVar20[0x1d] = 1;
      auVar20[0x1e] = 1;
      auVar20[0x1f] = 1;
      puVar8 = mask + (int)mask_stride;
      auVar25._8_2_ = 2;
      auVar25._0_8_ = 0x2000200020002;
      auVar25._10_2_ = 2;
      auVar25._12_2_ = 2;
      auVar25._14_2_ = 2;
      auVar25._16_2_ = 2;
      auVar25._18_2_ = 2;
      auVar25._20_2_ = 2;
      auVar25._22_2_ = 2;
      auVar25._24_2_ = 2;
      auVar25._26_2_ = 2;
      auVar25._28_2_ = 2;
      auVar25._30_2_ = 2;
      iVar11 = 0;
      auVar30._8_2_ = 0x40;
      auVar30._0_8_ = 0x40004000400040;
      auVar30._10_2_ = 0x40;
      auVar30._12_2_ = 0x40;
      auVar30._14_2_ = 0x40;
      auVar30._16_2_ = 0x40;
      auVar30._18_2_ = 0x40;
      auVar30._20_2_ = 0x40;
      auVar30._22_2_ = 0x40;
      auVar30._24_2_ = 0x40;
      auVar30._26_2_ = 0x40;
      auVar30._28_2_ = 0x40;
      auVar30._30_2_ = 0x40;
      do {
        if (0 < w) {
          lVar9 = 0;
          do {
            auVar23 = vpaddusb_avx2(*(undefined1 (*) [32])(mask + lVar9 * 2),
                                    *(undefined1 (*) [32])(puVar8 + lVar9 * 2));
            auVar39 = vpaddusb_avx2(*(undefined1 (*) [32])(puVar16 + lVar9 * 2),
                                    *(undefined1 (*) [32])(puVar13 + lVar9 * 2));
            auVar23 = vpmaddubsw_avx2(auVar23,auVar20);
            auVar39 = vpmaddubsw_avx2(auVar39,auVar20);
            auVar23 = vpaddw_avx2(auVar23,auVar25);
            auVar42 = vpsrlw_avx2(auVar23,2);
            auVar23 = vpaddw_avx2(auVar39,auVar25);
            auVar54 = vpsrlw_avx2(auVar23,2);
            auVar22 = vpsubw_avx2(auVar30,auVar42);
            auVar24 = vpsubw_avx2(auVar30,auVar54);
            auVar23 = vpmulhuw_avx2(*(undefined1 (*) [32])(src0 + lVar9),auVar42);
            auVar39 = vpmullw_avx2(*(undefined1 (*) [32])(src0 + lVar9),auVar42);
            auVar42 = vpunpckhwd_avx2(auVar39,auVar23);
            auVar40 = vpunpcklwd_avx2(auVar39,auVar23);
            auVar23 = vpmulhuw_avx2(auVar22,*(undefined1 (*) [32])(src1 + lVar9));
            auVar39 = vpmullw_avx2(*(undefined1 (*) [32])(src1 + lVar9),auVar22);
            auVar22 = vpunpckhwd_avx2(auVar39,auVar23);
            auVar50 = vpunpcklwd_avx2(auVar39,auVar23);
            auVar23 = vpmulhuw_avx2(auVar54,*(undefined1 (*) [32])(pCVar6 + lVar9));
            auVar39 = vpmullw_avx2(*(undefined1 (*) [32])(pCVar6 + lVar9),auVar54);
            auVar54 = vpunpckhwd_avx2(auVar39,auVar23);
            auVar53 = vpunpcklwd_avx2(auVar39,auVar23);
            auVar23 = vpmulhuw_avx2(auVar24,*(undefined1 (*) [32])(pCVar12 + lVar9));
            auVar39 = vpmullw_avx2(*(undefined1 (*) [32])(pCVar12 + lVar9),auVar24);
            auVar24 = vpunpckhwd_avx2(auVar39,auVar23);
            auVar61 = vpunpcklwd_avx2(auVar39,auVar23);
            auVar23 = vpaddd_avx2(auVar42,auVar17);
            auVar23 = vpaddd_avx2(auVar23,auVar22);
            auVar39 = vpsrad_avx2(auVar23,ZEXT416(uVar14));
            auVar23 = vpaddd_avx2(auVar17,auVar40);
            auVar23 = vpaddd_avx2(auVar50,auVar23);
            auVar23 = vpsrad_avx2(auVar23,ZEXT416(uVar14));
            auVar23 = vpackssdw_avx2(auVar23,auVar39);
            auVar39 = vpaddd_avx2(auVar54,auVar17);
            auVar39 = vpaddd_avx2(auVar39,auVar24);
            auVar22 = vpsrad_avx2(auVar39,ZEXT416(uVar14));
            auVar39 = vpaddd_avx2(auVar53,auVar17);
            auVar39 = vpaddd_avx2(auVar39,auVar61);
            auVar39 = vpsrad_avx2(auVar39,ZEXT416(uVar14));
            auVar39 = vpackssdw_avx2(auVar39,auVar22);
            auVar23 = vpmaxsw_avx2(auVar23,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar22 = vpminsw_avx2(auVar23,auVar19);
            auVar23 = vpmaxsw_avx2(auVar39,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar23 = vpminsw_avx2(auVar23,auVar19);
            *(undefined1 (*) [32])(*pauVar10 + lVar9 * 2) = auVar22;
            *(undefined1 (*) [32])(puVar7 + lVar9 * 2) = auVar23;
            lVar9 = lVar9 + 0x10;
          } while (lVar9 < w);
        }
        mask = mask + iVar15;
        iVar11 = iVar11 + 2;
        pCVar12 = pCVar12 + (int)(src1_stride * 2);
        src1 = src1 + (int)(src1_stride * 2);
        pCVar6 = pCVar6 + (int)(src0_stride * 2);
        src0 = src0 + (int)(src0_stride * 2);
        puVar7 = puVar7 + lVar2;
        pauVar10 = (undefined1 (*) [16])(*pauVar10 + lVar2);
        puVar13 = puVar13 + iVar15;
        puVar16 = puVar16 + iVar15;
        puVar8 = puVar8 + iVar15;
      } while (iVar11 < h);
    }
  }
  return;
}

Assistant:

void aom_highbd_blend_a64_d16_mask_avx2(
    uint8_t *dst8, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h, int subw, int subh,
    ConvolveParams *conv_params, const int bd) {
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst8);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int32_t round_offset =
      ((1 << (round_bits + bd)) + (1 << (round_bits + bd - 1)) -
       (1 << (round_bits - 1)))
      << AOM_BLEND_A64_ROUND_BITS;
  const __m256i v_round_offset = _mm256_set1_epi32(round_offset);
  const int shift = round_bits + AOM_BLEND_A64_ROUND_BITS;

  const __m256i clip_low = _mm256_setzero_si256();
  const __m256i clip_high = _mm256_set1_epi16((1 << bd) - 1);
  const __m256i mask_max = _mm256_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  assert(IMPLIES((void *)src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES((void *)src1 == dst, src1_stride == dst_stride));

  assert(h >= 4);
  assert(w >= 4);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  if (subw == 0 && subh == 0) {
    switch (w) {
      case 4:
        highbd_blend_a64_d16_mask_subw0_subh0_w4_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      case 8:
        highbd_blend_a64_d16_mask_subw0_subh0_w8_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      default:  // >= 16
        highbd_blend_a64_d16_mask_subw0_subh0_w16_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
    }

  } else if (subw == 1 && subh == 1) {
    switch (w) {
      case 4:
        highbd_blend_a64_d16_mask_subw1_subh1_w4_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      case 8:
        highbd_blend_a64_d16_mask_subw1_subh1_w8_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      default:  // >= 16
        highbd_blend_a64_d16_mask_subw1_subh1_w16_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
    }
  } else {
    // Sub-sampling in only one axis doesn't seem to happen very much, so fall
    // back to the vanilla C implementation instead of having all the optimised
    // code for these.
    aom_highbd_blend_a64_d16_mask_c(dst8, dst_stride, src0, src0_stride, src1,
                                    src1_stride, mask, mask_stride, w, h, subw,
                                    subh, conv_params, bd);
  }
}